

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 *local_128;
  undefined1 *puStack_120;
  int local_114;
  undefined1 local_110 [208];
  Data *local_40;
  undefined1 uStack_38;
  undefined7 uStack_37;
  undefined1 uStack_30;
  undefined8 uStack_2f;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_114 = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_128,&local_114,argv,0x60a00);
  local_110._0_8_ = (QArrayData *)0x0;
  local_110._8_8_ = L"qdbusxml2cpp";
  local_110._16_8_ = 0xc;
  QCoreApplication::setApplicationName((QString *)local_110);
  if ((QArrayData *)local_110._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_110._0_8_,2,0x10);
    }
  }
  local_110._0_8_ = (QArrayData *)0x0;
  local_110._8_8_ = L"0.8";
  local_110._16_8_ = 3;
  QCoreApplication::setApplicationVersion((QString *)local_110);
  if ((QArrayData *)local_110._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_110._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_110._0_8_,2,0x10);
    }
  }
  memset((QDBusXmlToCpp *)local_110,0,0xf0);
  local_110._200_8_ = &PTR__DiagnosticsReporter_001139a0;
  local_40 = (Data *)0x0;
  uStack_38 = 0;
  uStack_37 = 0;
  uStack_30 = 0;
  uStack_2f = 0;
  iVar1 = QDBusXmlToCpp::run((QDBusXmlToCpp *)local_110,(QCoreApplication *)&local_128);
  QDBusXmlToCpp::~QDBusXmlToCpp((QDBusXmlToCpp *)local_110);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    QCoreApplication::setApplicationName(QStringLiteral(PROGRAMNAME));
    QCoreApplication::setApplicationVersion(QStringLiteral(PROGRAMVERSION));

    return QDBusXmlToCpp().run(app);
}